

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O3

void TadsHttpRequestHeader::parse_headers
               (TadsHttpRequestHeader **hdr_list,TadsHttpRequestHeader **hdr_tail,int parse_first,
               StringRef *str,long ofs)

{
  uint uVar1;
  TadsHttpRequestHeader *pTVar2;
  char *p;
  byte *local_30;
  
  fix_multiline_headers(str,(int)ofs);
  local_30 = (byte *)(str->str + ofs);
  uVar1 = (uint)(byte)str->str[ofs];
  if ((0xd < uVar1) || ((0x2401U >> (uVar1 & 0x1f) & 1) == 0)) {
    if (*hdr_list == (TadsHttpRequestHeader *)0x0) {
      pTVar2 = (TadsHttpRequestHeader *)operator_new(0x18);
      TadsHttpRequestHeader(pTVar2,(char **)&local_30,parse_first);
      *hdr_tail = pTVar2;
      *hdr_list = pTVar2;
    }
    while ((0xd < *local_30 || ((0x2401U >> (*local_30 & 0x1f) & 1) == 0))) {
      pTVar2 = (TadsHttpRequestHeader *)operator_new(0x18);
      TadsHttpRequestHeader(pTVar2,(char **)&local_30,1);
      (*hdr_tail)->nxt = pTVar2;
      *hdr_tail = pTVar2;
    }
  }
  return;
}

Assistant:

static void parse_headers(TadsHttpRequestHeader *&hdr_list,
                              TadsHttpRequestHeader *&hdr_tail,
                              int parse_first,
                              StringRef *str, long ofs)
    {
        /* fix multiline headers */
        fix_multiline_headers(str, ofs);

        /* set up at the starting offset */
        char *p = str->get() + ofs;
        
        /* if we're already at a blank line, there are no headers */
        if (*p == '\0' || *p == '\r' || *p == '\n')
            return;
        
        /* 
         *   if there aren't any headers yet, parse the first one; otherwise
         *   we'll just add to the existing list 
         */
        if (hdr_list == 0)
            hdr_list = hdr_tail = new TadsHttpRequestHeader(p, parse_first);
        
        /* now parse until we find a blank line */
        while (*p != '\r' && *p != '\n' && *p != '\0')
            hdr_tail = hdr_tail->nxt = new TadsHttpRequestHeader(p, TRUE);
    }